

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shop.cpp
# Opt level: O0

void __thiscall SHOPManagement::Shop::saveAddress(Shop *this)

{
  bool bVar1;
  int iVar2;
  reference ppUVar3;
  reference ppAVar4;
  ostream *poVar5;
  long local_310;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8 [32];
  value_type local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  Address *local_208;
  Address *current_address;
  iterator __end2;
  iterator __begin2;
  vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_> *__range2;
  Person *pPerson;
  User *current;
  iterator __end1;
  iterator __begin1;
  vector<SHOPManagement::User_*,_std::allocator<SHOPManagement::User_*>_> *__range1;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  Shop *this_local;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28);
  std::__cxx11::stringstream::stringstream(local_1b0);
  __end1 = std::vector<SHOPManagement::User_*,_std::allocator<SHOPManagement::User_*>_>::begin
                     (&this->v_users);
  current = (User *)std::vector<SHOPManagement::User_*,_std::allocator<SHOPManagement::User_*>_>::
                    end(&this->v_users);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<SHOPManagement::User_**,_std::vector<SHOPManagement::User_*,_std::allocator<SHOPManagement::User_*>_>_>
                                *)&current);
    if (!bVar1) break;
    ppUVar3 = __gnu_cxx::
              __normal_iterator<SHOPManagement::User_**,_std::vector<SHOPManagement::User_*,_std::allocator<SHOPManagement::User_*>_>_>
              ::operator*(&__end1);
    if (*ppUVar3 == (User *)0x0) {
      local_310 = 0;
    }
    else {
      local_310 = __dynamic_cast(*ppUVar3,&User::typeinfo,&Person::typeinfo,0);
    }
    __end2 = std::vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>::
             begin((vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_> *)
                   (local_310 + 0xb0));
    current_address =
         (Address *)
         std::vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>::end
                   ((vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_> *
                    )(local_310 + 0xb0));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<SHOPManagement::Address_**,_std::vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>_>
                                  *)&current_address);
      if (!bVar1) break;
      ppAVar4 = __gnu_cxx::
                __normal_iterator<SHOPManagement::Address_**,_std::vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>_>
                ::operator*(&__end2);
      local_208 = *ppAVar4;
      iVar2 = Address::getPid(local_208);
      poVar5 = (ostream *)std::ostream::operator<<(local_1a0,iVar2);
      std::operator<<(poVar5,"|");
      Address::getName_abi_cxx11_(&local_228,local_208);
      poVar5 = std::operator<<(local_1a0,(string *)&local_228);
      std::operator<<(poVar5,"|");
      std::__cxx11::string::~string((string *)&local_228);
      Address::getCountry_abi_cxx11_(&local_248,local_208);
      poVar5 = std::operator<<(local_1a0,(string *)&local_248);
      std::operator<<(poVar5,"|");
      std::__cxx11::string::~string((string *)&local_248);
      Address::getCity_abi_cxx11_(&local_268,local_208);
      poVar5 = std::operator<<(local_1a0,(string *)&local_268);
      std::operator<<(poVar5,"|");
      std::__cxx11::string::~string((string *)&local_268);
      Address::getStreet_abi_cxx11_(&local_288,local_208);
      std::operator<<(local_1a0,(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::stringstream::str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_28,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2c8,"",&local_2c9);
      std::__cxx11::stringstream::str((string *)local_1b0);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator(&local_2c9);
      __gnu_cxx::
      __normal_iterator<SHOPManagement::Address_**,_std::vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<SHOPManagement::User_**,_std::vector<SHOPManagement::User_*,_std::allocator<SHOPManagement::User_*>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"data/ADDRESSES.dat",&local_2f1);
  Helper::saveFileByLine
            (&local_2f0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

void Shop::saveAddress()
    {
        std::vector<std::string> lines;
        std::stringstream ss;

        for (auto current : this->v_users)
        {
            Person *pPerson = dynamic_cast<Person *>(current);

            for (auto current_address : pPerson->v_adress_list)
            {
                ss << current_address->getPid() << "|";
                ss << current_address->getName() << "|";
                ss << current_address->getCountry() << "|";
                ss << current_address->getCity() << "|";
                ss << current_address->getStreet();
                lines.push_back(ss.str());
                ss.str("");
            }
        }

        Helper::saveFileByLine("data/ADDRESSES.dat", lines);
    }